

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompiledFilterShader.h
# Opt level: O0

void __thiscall Rml::CompiledFilter::CompiledFilter(CompiledFilter *this,CompiledFilter *param_1)

{
  CompiledFilter *param_1_local;
  CompiledFilter *this_local;
  
  UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>::UniqueRenderResource
            (&this->super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>,
             &param_1->super_UniqueRenderResource<Rml::CompiledFilter,_unsigned_long,_0UL>);
  return;
}

Assistant:

class RMLUICORE_API CompiledFilter final : public UniqueRenderResource<CompiledFilter, CompiledFilterHandle, CompiledFilterHandle(0)> {
public:
	CompiledFilter() = default;

	void AddHandleTo(FilterHandleList& list);

	void Release();

private:
	CompiledFilter(RenderManager* render_manager, CompiledFilterHandle resource_handle) : UniqueRenderResource(render_manager, resource_handle) {}
	friend class RenderManager;
}